

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall
embree::BVH4Factory::BVH4Triangle4i
          (BVH4Factory *this,Scene *scene,BuildVariant bvariant,IntersectVariant ivariant)

{
  bool bVar1;
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  undefined8 *puVar2;
  size_t sVar3;
  bool bStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  Intersectors intersectors;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&TriangleMi<4>::type,scene);
  intersectors.intersector1.intersect = (IntersectFunc)0x0;
  intersectors.intersector1.occluded = (OccludedFunc)0x0;
  intersectors.collider.collide = (CollideFunc)0x0;
  intersectors.collider.name = (char *)0x0;
  intersectors.ptr = (AccelData *)0x0;
  intersectors.leafIntersector = (void *)0x0;
  memset(&intersectors.intersector1.name,0,0xe0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x50),"default");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x50),"fast");
    ivariant = FAST;
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x50),"robust");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&bStack_188,"unknown traverser ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x50));
        std::operator+(&local_168,&bStack_188," for BVH4<Triangle4i>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_168);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      ivariant = ROBUST;
    }
  }
  BVH4Triangle4iIntersectors(&intersectors,this,this_00,ivariant);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"default");
  if (bVar1) {
    if (bvariant == HIGH_QUALITY) {
LAB_0040be19:
      builder = (*this->BVH4Triangle4iSceneBuilderFastSpatialSAH)(this_00,scene,0);
      goto LAB_0040be7f;
    }
    if (bvariant == DYNAMIC) {
LAB_0040be6d:
      bStack_190 = false;
LAB_0040be75:
      builder = (*this->BVH4BuilderTwoLevelTriangle4iMeshSAH)(this_00,scene,bStack_190);
      goto LAB_0040be7f;
    }
    if (bvariant != STATIC) {
      builder = (Builder *)0x0;
      goto LAB_0040be7f;
    }
LAB_0040bded:
    sVar3 = 0;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"sah");
    if (bVar1) goto LAB_0040bded;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"sah_fast_spatial")
    ;
    if (bVar1) goto LAB_0040be19;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"sah_presplit");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"dynamic");
      if (bVar1) goto LAB_0040be6d;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)&(scene->super_AccelN).field_0x188 + 0x30),"morton");
      if (!bVar1) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&bStack_188,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x30));
        std::operator+(&local_168,&bStack_188," for BVH4<Triangle4i>");
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),(string *)&local_168);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      bStack_190 = true;
      goto LAB_0040be75;
    }
    sVar3 = 0x100;
  }
  builder = (*this->BVH4Triangle4iSceneBuilderSAH)(this_00,scene,sVar3);
LAB_0040be7f:
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&intersectors);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4Triangle4i(Scene* scene, BuildVariant bvariant, IntersectVariant ivariant)
  {
    BVH4* accel = new BVH4(Triangle4i::type,scene);

    Accel::Intersectors intersectors;
    if      (scene->device->tri_traverser == "default") intersectors = BVH4Triangle4iIntersectors(accel,ivariant);
    else if (scene->device->tri_traverser == "fast"   ) intersectors = BVH4Triangle4iIntersectors(accel,IntersectVariant::FAST);
    else if (scene->device->tri_traverser == "robust" ) intersectors = BVH4Triangle4iIntersectors(accel,IntersectVariant::ROBUST);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown traverser "+scene->device->tri_traverser+" for BVH4<Triangle4i>");

    Builder* builder = nullptr;
    if (scene->device->tri_builder == "default"     ) {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,0); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,false); break;
      case BuildVariant::HIGH_QUALITY: builder = BVH4Triangle4iSceneBuilderFastSpatialSAH(accel,scene,0); break;
      }
    }
    else if (scene->device->tri_builder == "sah"         ) builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_fast_spatial" ) builder = BVH4Triangle4iSceneBuilderFastSpatialSAH(accel,scene,0);
    else if (scene->device->tri_builder == "sah_presplit") builder = BVH4Triangle4iSceneBuilderSAH(accel,scene,MODE_HIGH_QUALITY);
    else if (scene->device->tri_builder == "dynamic"     ) builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,false);
    else if (scene->device->tri_builder == "morton"      ) builder = BVH4BuilderTwoLevelTriangle4iMeshSAH(accel,scene,true);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->tri_builder+" for BVH4<Triangle4i>");

    return new AccelInstance(accel,builder,intersectors);
  }